

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# declaration.cc
# Opt level: O1

ostream * tchecker::parsing::operator<<(ostream *os,attr_t *attr)

{
  ostream *poVar1;
  
  poVar1 = std::__ostream_insert<char,std::char_traits<char>>
                     (os,(attr->_key)._M_dataplus._M_p,(attr->_key)._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,": ",2);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar1,(attr->_value)._M_dataplus._M_p,(attr->_value)._M_string_length);
  return os;
}

Assistant:

std::ostream & operator<<(std::ostream & os, tchecker::parsing::attr_t const & attr)
{
  os << attr.key() << ": " << attr.value();
  return os;
}